

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall
mkvparser::Segment::ParseNext
          (Segment *this,Cluster *pCurr,Cluster **pResult,longlong *pos,long *len)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  longlong lVar5;
  Cluster *pCVar6;
  ulong uVar7;
  longlong avail;
  longlong total;
  
  if (pCurr == (Cluster *)0x0) {
    __assert_fail("pCurr",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xa8c,
                  "long mkvparser::Segment::ParseNext(const Cluster *, const Cluster *&, long long &, long &)"
                 );
  }
  if (pCurr->m_pSegment == (Segment *)0x0) {
    __assert_fail("!pCurr->EOS()",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xa8d,
                  "long mkvparser::Segment::ParseNext(const Cluster *, const Cluster *&, long long &, long &)"
                 );
  }
  if (this->m_clusters == (Cluster **)0x0) {
    __assert_fail("m_clusters",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xa8e,
                  "long mkvparser::Segment::ParseNext(const Cluster *, const Cluster *&, long long &, long &)"
                 );
  }
  *pResult = (Cluster *)0x0;
  lVar4 = pCurr->m_index;
  if (-1 < lVar4) {
    if (this->m_clusters[lVar4] != pCurr) {
      __assert_fail("m_clusters[pCurr->m_index] == pCurr",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xa93,
                    "long mkvparser::Segment::ParseNext(const Cluster *, const Cluster *&, long long &, long &)"
                   );
    }
    if (lVar4 + 1 < this->m_clusterCount) {
      pCVar6 = this->m_clusters[lVar4 + 1];
    }
    else {
      lVar4 = LoadCluster(this,pos,len);
      if (lVar4 < 0) {
        return lVar4;
      }
      if (lVar4 != 0) {
        return 1;
      }
      pCVar6 = GetLast(this);
    }
    *pResult = pCVar6;
    return 0;
  }
  if (this->m_pos < 1) {
    __assert_fail("m_pos > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xaad,
                  "long mkvparser::Segment::ParseNext(const Cluster *, const Cluster *&, long long &, long &)"
                 );
  }
  iVar2 = (*this->m_pReader->_vptr_IMkvReader[1])(this->m_pReader,&total,&avail);
  if (iVar2 < 0) {
    return (long)iVar2;
  }
  if (total < avail && -1 < total) {
    __assert_fail("(total < 0) || (avail <= total)",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xab6,
                  "long mkvparser::Segment::ParseNext(const Cluster *, const Cluster *&, long long &, long &)"
                 );
  }
  lVar4 = this->m_start + this->m_size;
  if (this->m_size < 0) {
    lVar4 = -1;
  }
  lVar3 = pCurr->m_element_start;
  *pos = lVar3;
  if (-1 < pCurr->m_element_size) {
    lVar3 = pCurr->m_element_size + lVar3;
LAB_00115705:
    *pos = lVar3;
    do {
      lVar4 = DoParseNext(this,pResult,pos,len);
    } while (1 < lVar4);
    return lVar4;
  }
  if (lVar3 < avail) {
    lVar5 = GetUIntLength(this->m_pReader,lVar3,len);
    if (lVar5 < 0) {
      return lVar5;
    }
    if (lVar5 != 0) {
      return -3;
    }
    lVar3 = *len + *pos;
    if (-1 < lVar4 && lVar4 < lVar3) {
      return -2;
    }
    if (avail < lVar3) {
      return -3;
    }
    lVar5 = ReadUInt(this->m_pReader,*pos,len);
    if (lVar5 != 0x1f43b675) {
      return -1;
    }
    lVar3 = *pos + *len;
    *pos = lVar3;
    if (lVar3 < avail) {
      lVar5 = GetUIntLength(this->m_pReader,lVar3,len);
      if (lVar5 < 0) {
        return lVar5;
      }
      if (lVar5 != 0) {
        return -3;
      }
      lVar3 = *len + *pos;
      if (lVar4 < 0 || lVar3 <= lVar4) {
        if (avail < lVar3) {
          return -3;
        }
        uVar7 = ReadUInt(this->m_pReader,*pos,len);
        if ((long)uVar7 < 0) {
          return uVar7;
        }
        lVar1 = *len;
        lVar3 = *pos + lVar1;
        *pos = lVar3;
        if ((-1L << ((char)lVar1 * '\a' & 0x3fU) ^ uVar7) != 0xffffffffffffffff) {
          lVar3 = lVar3 + uVar7;
          if ((-1 < lVar4) && (lVar4 < lVar3)) {
            return -2;
          }
          goto LAB_00115705;
        }
      }
      return -2;
    }
  }
  *len = 1;
  return -3;
}

Assistant:

long Segment::ParseNext(const Cluster* pCurr, const Cluster*& pResult,
                        long long& pos, long& len) {
  assert(pCurr);
  assert(!pCurr->EOS());
  assert(m_clusters);

  pResult = 0;

  if (pCurr->m_index >= 0) {  // loaded (not merely preloaded)
    assert(m_clusters[pCurr->m_index] == pCurr);

    const long next_idx = pCurr->m_index + 1;

    if (next_idx < m_clusterCount) {
      pResult = m_clusters[next_idx];
      return 0;  // success
    }

    // curr cluster is last among loaded

    const long result = LoadCluster(pos, len);

    if (result < 0)  // error or underflow
      return result;

    if (result > 0)  // no more clusters
    {
      // pResult = &m_eos;
      return 1;
    }

    pResult = GetLast();
    return 0;  // success
  }

  assert(m_pos > 0);

  long long total, avail;

  long status = m_pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  // interrogate curr cluster

  pos = pCurr->m_element_start;

  if (pCurr->m_element_size >= 0)
    pos += pCurr->m_element_size;
  else {
    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadUInt(m_pReader, pos, len);

    if (id != libwebm::kMkvCluster)
      return -1;

    pos += len;  // consume ID

    // Read Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(m_pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume size field

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size == unknown_size)  // TODO: should never happen
      return E_FILE_FORMAT_INVALID;  // TODO: resolve this

    // assert((pCurr->m_size <= 0) || (pCurr->m_size == size));

    if ((segment_stop >= 0) && ((pos + size) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    // Pos now points to start of payload

    pos += size;  // consume payload (that is, the current cluster)
    if (segment_stop >= 0 && pos > segment_stop)
      return E_FILE_FORMAT_INVALID;

    // By consuming the payload, we are assuming that the curr
    // cluster isn't interesting.  That is, we don't bother checking
    // whether the payload of the curr cluster is less than what
    // happens to be available (obtained via IMkvReader::Length).
    // Presumably the caller has already dispensed with the current
    // cluster, and really does want the next cluster.
  }

  // pos now points to just beyond the last fully-loaded cluster

  for (;;) {
    const long status = DoParseNext(pResult, pos, len);

    if (status <= 1)
      return status;
  }
}